

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O1

void init_scoring(int n_row,int n_col,Colamd_Row *Row,Colamd_Col *Col,int *A,int *head,double *knobs
                 ,int *p_n_row2,int *p_n_col2,int *p_max_deg)

{
  int *piVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  Colamd_Col *pCVar9;
  int iVar10;
  int iVar11;
  int *piVar12;
  anon_union_4_2_db423fdf_for_shared4 *paVar13;
  int *piVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  
  dVar2 = *knobs;
  if (0.0 <= dVar2) {
    dVar17 = (double)n_col;
    if (dVar17 < 0.0) {
      dVar16 = sqrt(dVar17);
    }
    else {
      dVar16 = SQRT(dVar17);
    }
    iVar8 = 0x10;
    if (16.0 <= dVar2 * dVar16) {
      dVar2 = *knobs;
      if (dVar17 < 0.0) {
        dVar17 = sqrt(dVar17);
      }
      else {
        dVar17 = SQRT(dVar17);
      }
      iVar8 = (int)(dVar2 * dVar17);
    }
  }
  else {
    iVar8 = n_col + -1;
  }
  dVar2 = knobs[1];
  if (0.0 <= dVar2) {
    iVar4 = n_col;
    if (n_row < n_col) {
      iVar4 = n_row;
    }
    dVar17 = (double)iVar4;
    if (dVar17 < 0.0) {
      dVar16 = sqrt(dVar17);
    }
    else {
      dVar16 = SQRT(dVar17);
    }
    iVar4 = 0x10;
    if (16.0 <= dVar2 * dVar16) {
      dVar2 = knobs[1];
      if (dVar17 < 0.0) {
        dVar17 = sqrt(dVar17);
      }
      else {
        dVar17 = SQRT(dVar17);
      }
      iVar4 = (int)(dVar2 * dVar17);
    }
  }
  else {
    iVar4 = n_row + -1;
  }
  uVar15 = (ulong)(n_col - 1);
  iVar10 = n_col;
  if (0 < n_col) {
    pCVar9 = Col + uVar15;
    lVar7 = uVar15 + 1;
    do {
      if (pCVar9->length == 0) {
        iVar10 = iVar10 + -1;
        (pCVar9->shared2).score = iVar10;
        pCVar9->start = -1;
      }
      pCVar9 = pCVar9 + -1;
      lVar6 = lVar7 + -1;
      bVar3 = 0 < lVar7;
      lVar7 = lVar6;
    } while (lVar6 != 0 && bVar3);
  }
  uVar5 = uVar15;
  if (0 < n_col) {
    do {
      if (-1 < (long)Col[uVar5].start) {
        pCVar9 = Col + uVar5;
        iVar11 = pCVar9->length;
        if (iVar4 < iVar11) {
          iVar10 = iVar10 + -1;
          (pCVar9->shared2).score = iVar10;
          if (0 < iVar11) {
            piVar12 = A + Col[uVar5].start;
            piVar1 = piVar12 + iVar11;
            do {
              iVar11 = *piVar12;
              piVar12 = piVar12 + 1;
              Row[iVar11].shared1.degree = Row[iVar11].shared1.degree + -1;
            } while (piVar12 < piVar1);
          }
          pCVar9->start = -1;
        }
      }
      bVar3 = 0 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
  }
  if (n_row < 1) {
    iVar4 = 0;
  }
  else {
    uVar5 = (ulong)(uint)n_row;
    lVar7 = 0;
    iVar4 = 0;
    do {
      iVar11 = *(int *)((long)&Row->shared1 + lVar7);
      if (iVar8 < iVar11 || iVar11 == 0) {
        *(undefined4 *)((long)&Row->shared2 + lVar7) = 0xffffffff;
        n_row = n_row + -1;
      }
      else if (iVar4 <= iVar11) {
        iVar4 = iVar11;
      }
      lVar7 = lVar7 + 0x10;
    } while (uVar5 << 4 != lVar7);
  }
  uVar5 = uVar15;
  if (0 < n_col) {
    do {
      if (-1 < (long)Col[uVar5].start) {
        pCVar9 = Col + uVar5;
        piVar12 = A + Col[uVar5].start;
        piVar1 = piVar12 + pCVar9->length;
        piVar14 = piVar12;
        iVar8 = 0;
        while (piVar14 < piVar1) {
          iVar11 = *piVar14;
          piVar14 = piVar14 + 1;
          if (-1 < Row[iVar11].shared2.mark) {
            *piVar12 = iVar11;
            piVar12 = piVar12 + 1;
            iVar8 = iVar8 + Row[iVar11].shared1.degree + -1;
            if (n_col <= iVar8) {
              iVar8 = n_col;
            }
          }
        }
        iVar11 = (int)((ulong)((long)piVar12 - (long)(A + (uint)pCVar9->start)) >> 2);
        if (iVar11 == 0) {
          iVar10 = iVar10 + -1;
          (pCVar9->shared2).score = iVar10;
          pCVar9->start = -1;
        }
        else {
          pCVar9->length = iVar11;
          (pCVar9->shared2).score = iVar8;
        }
      }
      bVar3 = 0 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
  }
  if (-1 < n_col) {
    memset(head,0xff,(ulong)(uint)n_col * 4 + 4);
  }
  if (0 < n_col) {
    paVar13 = &Col[uVar15].shared4;
    do {
      if (-1 < ((Colamd_Col *)(paVar13 + -5))->start) {
        iVar8 = ((anon_union_4_2_0da084e5_for_shared2 *)(paVar13 + -2))->score;
        iVar11 = head[iVar8];
        ((anon_union_4_3_eabe2f71_for_shared3 *)(paVar13 + -1))->headhash = -1;
        paVar13->degree_next = iVar11;
        if ((long)iVar11 != -1) {
          Col[iVar11].shared3.headhash = (int)uVar15;
        }
        head[iVar8] = (int)uVar15;
      }
      paVar13 = paVar13 + -6;
      bVar3 = 0 < (long)uVar15;
      uVar15 = uVar15 - 1;
    } while (bVar3);
  }
  *p_n_col2 = iVar10;
  *p_n_row2 = n_row;
  *p_max_deg = iVar4;
  return;
}

Assistant:

PRIVATE void init_scoring
(
    /* === Parameters ======================================================= */

    Int n_row,			/* number of rows of A */
    Int n_col,			/* number of columns of A */
    Colamd_Row Row [],		/* of size n_row+1 */
    Colamd_Col Col [],		/* of size n_col+1 */
    Int A [],			/* column form and row form of A */
    Int head [],		/* of size n_col+1 */
    double knobs [COLAMD_KNOBS],/* parameters */
    Int *p_n_row2,		/* number of non-dense, non-empty rows */
    Int *p_n_col2,		/* number of non-dense, non-empty columns */
    Int *p_max_deg		/* maximum row degree */
)
{
    /* === Local variables ================================================== */

    Int c ;			/* a column index */
    Int r, row ;		/* a row index */
    Int *cp ;			/* a column pointer */
    Int deg ;			/* degree of a row or column */
    Int *cp_end ;		/* a pointer to the end of a column */
    Int *new_cp ;		/* new column pointer */
    Int col_length ;		/* length of pruned column */
    Int score ;			/* current column score */
    Int n_col2 ;		/* number of non-dense, non-empty columns */
    Int n_row2 ;		/* number of non-dense, non-empty rows */
    Int dense_row_count ;	/* remove rows with more entries than this */
    Int dense_col_count ;	/* remove cols with more entries than this */
    Int min_score ;		/* smallest column score */
    Int max_deg ;		/* maximum row degree */
    Int next_col ;		/* Used to add to degree list.*/

#ifndef NDEBUG
    Int debug_count ;		/* debug only. */
#endif /* NDEBUG */

    /* === Extract knobs ==================================================== */

    /* Note: if knobs contains a NaN, this is undefined: */
    if (knobs [COLAMD_DENSE_ROW] < 0)
    {
	/* only remove completely dense rows */
	dense_row_count = n_col-1 ;
    }
    else
    {
	dense_row_count = DENSE_DEGREE (knobs [COLAMD_DENSE_ROW], n_col) ;
    }
    if (knobs [COLAMD_DENSE_COL] < 0)
    {
	/* only remove completely dense columns */
	dense_col_count = n_row-1 ;
    }
    else
    {
	dense_col_count =
	    DENSE_DEGREE (knobs [COLAMD_DENSE_COL], MIN (n_row, n_col)) ;
    }

    DEBUG1 (("colamd: densecount: %d %d\n", dense_row_count, dense_col_count)) ;
    max_deg = 0 ;
    n_col2 = n_col ;
    n_row2 = n_row ;

    /* === Kill empty columns =============================================== */

    /* Put the empty columns at the end in their natural order, so that LU */
    /* factorization can proceed as far as possible. */
    for (c = n_col-1 ; c >= 0 ; c--)
    {
	deg = Col [c].length ;
	if (deg == 0)
	{
	    /* this is a empty column, kill and order it last */
	    Col [c].shared2.order = --n_col2 ;
	    KILL_PRINCIPAL_COL (c) ;
	}
    }
    DEBUG1 (("colamd: null columns killed: %d\n", n_col - n_col2)) ;

    /* === Kill dense columns =============================================== */

    /* Put the dense columns at the end, in their natural order */
    for (c = n_col-1 ; c >= 0 ; c--)
    {
	/* skip any dead columns */
	if (COL_IS_DEAD (c))
	{
	    continue ;
	}
	deg = Col [c].length ;
	if (deg > dense_col_count)
	{
	    /* this is a dense column, kill and order it last */
	    Col [c].shared2.order = --n_col2 ;
	    /* decrement the row degrees */
	    cp = &A [Col [c].start] ;
	    cp_end = cp + Col [c].length ;
	    while (cp < cp_end)
	    {
		Row [*cp++].shared1.degree-- ;
	    }
	    KILL_PRINCIPAL_COL (c) ;
	}
    }
    DEBUG1 (("colamd: Dense and null columns killed: %d\n", n_col - n_col2)) ;

    /* === Kill dense and empty rows ======================================== */

    for (r = 0 ; r < n_row ; r++)
    {
	deg = Row [r].shared1.degree ;
	ASSERT (deg >= 0 && deg <= n_col) ;
	if (deg > dense_row_count || deg == 0)
	{
	    /* kill a dense or empty row */
	    KILL_ROW (r) ;
	    --n_row2 ;
	}
	else
	{
	    /* keep track of max degree of remaining rows */
	    max_deg = MAX (max_deg, deg) ;
	}
    }
    DEBUG1 (("colamd: Dense and null rows killed: %d\n", n_row - n_row2)) ;

    /* === Compute initial column scores ==================================== */

    /* At this point the row degrees are accurate.  They reflect the number */
    /* of "live" (non-dense) columns in each row.  No empty rows exist. */
    /* Some "live" columns may contain only dead rows, however.  These are */
    /* pruned in the code below. */

    /* now find the initial matlab score for each column */
    for (c = n_col-1 ; c >= 0 ; c--)
    {
	/* skip dead column */
	if (COL_IS_DEAD (c))
	{
	    continue ;
	}
	score = 0 ;
	cp = &A [Col [c].start] ;
	new_cp = cp ;
	cp_end = cp + Col [c].length ;
	while (cp < cp_end)
	{
	    /* get a row */
	    row = *cp++ ;
	    /* skip if dead */
	    if (ROW_IS_DEAD (row))
	    {
		continue ;
	    }
	    /* compact the column */
	    *new_cp++ = row ;
	    /* add row's external degree */
	    score += Row [row].shared1.degree - 1 ;
	    /* guard against integer overflow */
	    score = MIN (score, n_col) ;
	}
	/* determine pruned column length */
	col_length = (Int) (new_cp - &A [Col [c].start]) ;
	if (col_length == 0)
	{
	    /* a newly-made null column (all rows in this col are "dense" */
	    /* and have already been killed) */
	    DEBUG2 (("Newly null killed: %d\n", c)) ;
	    Col [c].shared2.order = --n_col2 ;
	    KILL_PRINCIPAL_COL (c) ;
	}
	else
	{
	    /* set column length and set score */
	    ASSERT (score >= 0) ;
	    ASSERT (score <= n_col) ;
	    Col [c].length = col_length ;
	    Col [c].shared2.score = score ;
	}
    }
    DEBUG1 (("colamd: Dense, null, and newly-null columns killed: %d\n",
    	n_col-n_col2)) ;

    /* At this point, all empty rows and columns are dead.  All live columns */
    /* are "clean" (containing no dead rows) and simplicial (no supercolumns */
    /* yet).  Rows may contain dead columns, but all live rows contain at */
    /* least one live column. */

#ifndef NDEBUG
    debug_structures (n_row, n_col, Row, Col, A, n_col2) ;
#endif /* NDEBUG */

    /* === Initialize degree lists ========================================== */

#ifndef NDEBUG
    debug_count = 0 ;
#endif /* NDEBUG */

    /* clear the hash buckets */
    for (c = 0 ; c <= n_col ; c++)
    {
	head [c] = COLAMD_EMPTY ;
    }
    min_score = n_col ;
    /* place in reverse order, so low column indices are at the front */
    /* of the lists.  This is to encourage natural tie-breaking */
    for (c = n_col-1 ; c >= 0 ; c--)
    {
	/* only add principal columns to degree lists */
	if (COL_IS_ALIVE (c))
	{
	    DEBUG4 (("place %d score %d minscore %d ncol %d\n",
		c, Col [c].shared2.score, min_score, n_col)) ;

	    /* === Add columns score to DList =============================== */

	    score = Col [c].shared2.score ;

	    ASSERT (min_score >= 0) ;
	    ASSERT (min_score <= n_col) ;
	    ASSERT (score >= 0) ;
	    ASSERT (score <= n_col) ;
	    ASSERT (head [score] >= COLAMD_EMPTY) ;

	    /* now add this column to dList at proper score location */
	    next_col = head [score] ;
	    Col [c].shared3.prev = COLAMD_EMPTY ;
	    Col [c].shared4.degree_next = next_col ;

	    /* if there already was a column with the same score, set its */
	    /* previous pointer to this new column */
	    if (next_col != COLAMD_EMPTY)
	    {
		Col [next_col].shared3.prev = c ;
	    }
	    head [score] = c ;

	    /* see if this score is less than current min */
	    min_score = MIN (min_score, score) ;

#ifndef NDEBUG
	    debug_count++ ;
#endif /* NDEBUG */

	}
    }

#ifndef NDEBUG
    DEBUG1 (("colamd: Live cols %d out of %d, non-princ: %d\n",
	debug_count, n_col, n_col-debug_count)) ;
    ASSERT (debug_count == n_col2) ;
    debug_deg_lists (n_row, n_col, Row, Col, head, min_score, n_col2, max_deg) ;
#endif /* NDEBUG */

    /* === Return number of remaining columns, and max row degree =========== */

    *p_n_col2 = n_col2 ;
    *p_n_row2 = n_row2 ;
    *p_max_deg = max_deg ;
}